

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void OpticsParser::parseIntegratedResults(ProductData *product,json *product_json)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  byte bVar4;
  optional<double> oVar5;
  optional<double> oVar6;
  optional<double> oVar7;
  optional<double> oVar8;
  optional<double> oVar9;
  value_type integrated_results;
  allocator<char> local_12a;
  byte local_129;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  string local_120;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_100;
  undefined4 local_ed;
  undefined3 uStack_e9;
  undefined4 local_e6;
  undefined3 uStack_e2;
  undefined4 local_df;
  undefined3 uStack_db;
  undefined4 local_d8;
  undefined3 uStack_d4;
  undefined4 local_d1;
  undefined3 uStack_cd;
  undefined4 local_ca;
  undefined3 uStack_c6;
  undefined4 local_c3;
  undefined3 uStack_bf;
  undefined4 local_bc;
  undefined3 uStack_b8;
  undefined4 local_b5;
  undefined3 uStack_b1;
  undefined4 local_ae;
  undefined3 uStack_aa;
  undefined4 local_a7;
  undefined3 uStack_a3;
  _Storage<double,_true> local_a0;
  _Storage<double,_true> local_98;
  _Storage<double,_true> local_90;
  _Storage<double,_true> local_88;
  _Storage<double,_true> local_80;
  _Storage<double,_true> local_78;
  _Storage<double,_true> local_70;
  _Storage<double,_true> local_68;
  _Storage<double,_true> local_60;
  _Storage<double,_true> local_58;
  _Storage<double,_true> local_50;
  _Storage<double,_true> local_48;
  _Storage<double,_true> local_40;
  _Storage<double,_true> local_38;
  
  sVar2 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::count<const_char_(&)[27],_0>(product_json,(char (*) [27])"integrated_results_summary");
  if (sVar2 != 0) {
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::at<const_char_(&)[27],_0>(product_json,(char (*) [27])"integrated_results_summary");
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::empty(pvVar3);
    if (!bVar1) {
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::at<const_char_(&)[27],_0>(product_json,(char (*) [27])"integrated_results_summary")
      ;
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](pvVar3,0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&local_100,pvVar3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tfsol",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_38 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_121 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rfsol",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_40 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_122 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tfvis",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_48 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_123 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rfvis",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_50 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_124 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rbvis",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_58 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_125 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tdw",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_60 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_126 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tuv",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_68 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_127 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tspf",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_70 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_128 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tciex",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_78 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      local_129 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_engaged;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tciey",&local_12a);
      oVar5 = get_optional_field<double>(&local_100,&local_120);
      local_80 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"tciez",&local_12a);
      oVar6 = get_optional_field<double>(&local_100,&local_120);
      local_88 = oVar6.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rfciex",&local_12a);
      oVar7 = get_optional_field<double>(&local_100,&local_120);
      local_90 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rfciey",&local_12a);
      oVar8 = get_optional_field<double>(&local_100,&local_120);
      local_98 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"rfciez",&local_12a);
      oVar9 = get_optional_field<double>(&local_100,&local_120);
      local_a0 = oVar9.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
      bVar4 = oVar5.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged & local_129;
      std::__cxx11::string::~string((string *)&local_120);
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        solarTransmittanceFront.super__Optional_base<double,_true,_true> = local_38;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 8) =
           local_121;
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 9) =
           local_a7;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0xc) = CONCAT31(uStack_a3,local_a7._3_1_);
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        solarReflectanceFront.super__Optional_base<double,_true,_true> = local_40;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x18) =
           local_122;
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x19) =
           local_ae;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x1c) = CONCAT31(uStack_aa,local_ae._3_1_);
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x28) =
           0;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x2c) = CONCAT31(uStack_b1,local_b5._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x29) =
           local_b5;
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        visibleTransmittanceFront.super__Optional_base<double,_true,_true> = local_48;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x38) =
           local_123;
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x39) =
           local_bc;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x3c) = CONCAT31(uStack_b8,local_bc._3_1_);
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        visibleReflectanceFront.super__Optional_base<double,_true,_true> = local_50;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x48) =
           local_124;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x4c) = CONCAT31(uStack_bf,local_c3._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x49) =
           local_c3;
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        visibleReflectanceBack.super__Optional_base<double,_true,_true> = local_58;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x58) =
           local_125;
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x59) =
           local_ca;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x5c) = CONCAT31(uStack_c6,local_ca._3_1_);
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        dwTransmittance.super__Optional_base<double,_true,_true> = local_60;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x68) =
           local_126;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x6c) = CONCAT31(uStack_cd,local_d1._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x69) =
           local_d1;
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        spfTransmittance.super__Optional_base<double,_true,_true> = local_70;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x78) =
           local_128;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x7c) = CONCAT31(uStack_d4,local_d8._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x79) =
           local_d8;
      *(_Storage<double,_true> *)
       &(product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload._M_value.
        uvTransmittance.super__Optional_base<double,_true,_true> = local_68;
      *(undefined1 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x88) =
           local_127;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0x8c) = CONCAT31(uStack_db,local_df._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x89) =
           local_df;
      *(_Storage<double,_true> *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x90) =
           local_78;
      *(_Storage<double,_true> *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0x98) =
           local_80;
      *(_Storage<double,_true> *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0xa0) =
           local_88;
      *(byte *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0xa8) =
           bVar4 & oVar6.super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_engaged & 1;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0xac) = CONCAT31(uStack_e2,local_e6._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0xa9) =
           local_e6;
      *(_Storage<double,_true> *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0xb0) =
           local_90;
      *(_Storage<double,_true> *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0xb8) =
           local_98;
      *(_Storage<double,_true> *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0xc0) =
           local_a0;
      *(byte *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 200) =
           oVar8.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged &
           oVar7.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged &
           oVar9.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged & 1;
      *(uint *)((long)&(product->precalculatedResults).
                       super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>.
                       _M_payload.super__Optional_payload_base<OpticsParser::PrecalculatedResults>.
                       _M_payload + 0xcc) = CONCAT31(uStack_e9,local_ed._3_1_);
      *(undefined4 *)
       ((long)&(product->precalculatedResults).
               super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
               super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_payload + 0xc9) =
           local_ed;
      if ((product->precalculatedResults).
          super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
          super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_engaged == false) {
        (product->precalculatedResults).
        super__Optional_base<OpticsParser::PrecalculatedResults,_true,_true>._M_payload.
        super__Optional_payload_base<OpticsParser::PrecalculatedResults>._M_engaged = true;
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json(&local_100);
    }
  }
  return;
}

Assistant:

void parseIntegratedResults(ProductData & product, nlohmann::json const & product_json)
    {
        if(product_json.count("integrated_results_summary") == 0
           || product_json.at("integrated_results_summary").empty())
        {
            return;
        }
        auto integrated_results = product_json.at("integrated_results_summary")[0];
        PrecalculatedResults result;

        result.solarTransmittanceFront = get_optional_field<double>(integrated_results, "tfsol");
        result.solarReflectanceFront = get_optional_field<double>(integrated_results, "rfsol");
        result.visibleTransmittanceFront = get_optional_field<double>(integrated_results, "tfvis");
        result.visibleReflectanceFront = get_optional_field<double>(integrated_results, "rfvis");
        result.visibleReflectanceBack = get_optional_field<double>(integrated_results, "rbvis");
        result.dwTransmittance = get_optional_field<double>(integrated_results, "tdw");
        result.uvTransmittance = get_optional_field<double>(integrated_results, "tuv");
        result.spfTransmittance = get_optional_field<double>(integrated_results, "tspf");
        auto tcie_x = get_optional_field<double>(integrated_results, "tciex");
        auto tcie_y = get_optional_field<double>(integrated_results, "tciey");
        auto tcie_z = get_optional_field<double>(integrated_results, "tciez");
        if(tcie_x.has_value() && tcie_y.has_value() && tcie_z.has_value())
        {
            result.cieTransmittance = CIEValue{*tcie_x, *tcie_y, *tcie_z};
        }
        auto rfcie_x = get_optional_field<double>(integrated_results, "rfciex");
        auto rfcie_y = get_optional_field<double>(integrated_results, "rfciey");
        auto rfcie_z = get_optional_field<double>(integrated_results, "rfciez");
        if(rfcie_x.has_value() && rfcie_y.has_value() && rfcie_z.has_value())
        {
            result.cieReflectanceFront = CIEValue{*rfcie_x, *rfcie_y, *rfcie_z};
        }
        product.precalculatedResults = result;
    }